

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O2

void __thiscall KNNClassifier::KNNClassifier(KNNClassifier *this,uint n_neighbors)

{
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&this->matrizX);
  (this->matrizY).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->matrizY).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->matrizY).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  this->k = n_neighbors;
  return;
}

Assistant:

KNNClassifier::KNNClassifier(unsigned int n_neighbors)
{
  k = n_neighbors;
}